

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void square_set_door_lock(chunk_conflict2 *c,loc_conflict grid,wchar_t power)

{
  _Bool _Var1;
  trap_kind_conflict *ptVar2;
  trap *local_30;
  trap *trap;
  trap_kind_conflict *lock;
  wchar_t power_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  ptVar2 = lookup_trap("door lock");
  _Var1 = square_iscloseddoor((chunk *)c,grid);
  if (_Var1) {
    _Var1 = square_trap_specific(c,grid,ptVar2->tidx);
    if (!_Var1) {
      place_trap(c,grid,ptVar2->tidx,L'\0');
    }
    for (local_30 = square_trap((chunk *)c,grid); local_30 != (trap *)0x0; local_30 = local_30->next
        ) {
      if (local_30->kind == ptVar2) {
        local_30->power = (uint8_t)power;
      }
    }
  }
  return;
}

Assistant:

void square_set_door_lock(struct chunk *c, struct loc grid, int power)
{
	struct trap_kind *lock = lookup_trap("door lock");
	struct trap *trap;

	/* Verify it's a closed door */
	if (!square_iscloseddoor(c, grid))
		return;

	/* If there's no lock there, add one */
	if (!square_trap_specific(c, grid, lock->tidx))
		place_trap(c, grid, lock->tidx, 0);

	/* Set the power (of all locks - there should be only one) */
	trap = square_trap(c, grid);
	while (trap) {
		if (trap->kind == lock)
			trap->power = power;
		trap = trap->next;
	}
}